

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O3

int __thiscall anon_unknown.dwarf_25070a::NullBackend::mixerProc(NullBackend *this)

{
  ALuint AVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ALCdevice *pAVar10;
  ulong uVar11;
  timespec local_40;
  
  pAVar10 = (this->super_BackendBase).mDevice;
  uVar2 = pAVar10->Frequency;
  AVar1 = pAVar10->UpdateSize;
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  lVar4 = std::chrono::_V2::steady_clock::now();
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    uVar11 = 0;
    uVar8 = (ulong)(AVar1 * 1000) / (ulong)uVar2;
    uVar2 = (uint)uVar8;
    uVar8 = uVar8 / 2000;
    do {
      if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
        return 0;
      }
      lVar5 = std::chrono::_V2::steady_clock::now();
      pAVar10 = (this->super_BackendBase).mDevice;
      uVar9 = (ulong)pAVar10->UpdateSize;
      lVar5 = (long)((lVar5 - lVar4) * (ulong)pAVar10->Frequency) / 1000000000;
      if ((long)(lVar5 - uVar11) < (long)uVar9) {
        uVar9 = uVar8;
        lVar5 = (uVar8 * -1000 + (ulong)(uVar2 >> 1)) * 1000000;
        if (1 < uVar2) {
          do {
            local_40.tv_nsec = lVar5;
            local_40.tv_sec = uVar9;
            iVar3 = nanosleep(&local_40,&local_40);
            if (iVar3 != -1) break;
            piVar6 = __errno_location();
            uVar9 = local_40.tv_sec;
            lVar5 = local_40.tv_nsec;
          } while (*piVar6 == 4);
        }
      }
      else {
        do {
          ALCdevice::renderSamples(pAVar10,(void *)0x0,(ALuint)uVar9,0);
          pAVar10 = (this->super_BackendBase).mDevice;
          uVar9 = (ulong)pAVar10->UpdateSize;
          uVar11 = uVar11 + uVar9;
        } while ((long)uVar9 <= (long)(lVar5 - uVar11));
        uVar9 = (ulong)pAVar10->Frequency;
        if ((long)uVar9 <= (long)uVar11) {
          uVar7 = uVar11 / uVar9;
          uVar11 = uVar11 % uVar9;
          lVar4 = lVar4 + uVar7 * 1000000000;
        }
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int NullBackend::mixerProc()
{
    const milliseconds restTime{mDevice->UpdateSize*1000/mDevice->Frequency / 2};

    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    int64_t done{0};
    auto start = std::chrono::steady_clock::now();
    while(!mKillNow.load(std::memory_order_acquire)
        && mDevice->Connected.load(std::memory_order_acquire))
    {
        auto now = std::chrono::steady_clock::now();

        /* This converts from nanoseconds to nanosamples, then to samples. */
        int64_t avail{std::chrono::duration_cast<seconds>((now-start) * mDevice->Frequency).count()};
        if(avail-done < mDevice->UpdateSize)
        {
            std::this_thread::sleep_for(restTime);
            continue;
        }
        while(avail-done >= mDevice->UpdateSize)
        {
            mDevice->renderSamples(nullptr, mDevice->UpdateSize, 0u);
            done += mDevice->UpdateSize;
        }

        /* For every completed second, increment the start time and reduce the
         * samples done. This prevents the difference between the start time
         * and current time from growing too large, while maintaining the
         * correct number of samples to render.
         */
        if(done >= mDevice->Frequency)
        {
            seconds s{done/mDevice->Frequency};
            start += s;
            done -= mDevice->Frequency*s.count();
        }
    }

    return 0;
}